

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall soplex::CLUFactor<double>::packRows(CLUFactor<double> *this)

{
  U *pUVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  pointer pdVar7;
  int *piVar8;
  int *piVar9;
  Dring *pDVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  
  pUVar1 = &this->u;
  pDVar10 = (this->u).row.list.next;
  piVar5 = (this->u).row.max;
  if ((U *)pDVar10 == pUVar1) {
    uVar12 = 0;
  }
  else {
    piVar6 = (this->u).row.idx;
    pdVar7 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->u).row.len;
    piVar9 = (this->u).row.start;
    uVar13 = 0;
    do {
      iVar2 = pDVar10->idx;
      if (piVar9[iVar2] != (int)uVar13) goto LAB_00201faf;
      iVar3 = piVar8[iVar2];
      uVar12 = (int)uVar13 + iVar3;
      uVar13 = (ulong)uVar12;
      piVar5[iVar2] = iVar3;
      pDVar10 = pDVar10->next;
    } while ((U *)pDVar10 != pUVar1);
  }
LAB_00201ffa:
  piVar5[this->thedim] = 0;
  (this->u).row.used = uVar12;
  return;
LAB_00201faf:
  do {
    iVar2 = pDVar10->idx;
    iVar3 = piVar9[iVar2];
    lVar11 = (long)iVar3;
    piVar9[iVar2] = (int)uVar13;
    iVar4 = piVar8[iVar2];
    piVar5[iVar2] = iVar4;
    if (0 < iVar4) {
      uVar13 = (ulong)(int)uVar13;
      do {
        piVar6[uVar13] = piVar6[lVar11];
        pdVar7[uVar13] = pdVar7[lVar11];
        lVar11 = lVar11 + 1;
        uVar13 = uVar13 + 1;
      } while (lVar11 < iVar4 + iVar3);
    }
    uVar12 = (uint)uVar13;
    pDVar10 = pDVar10->next;
  } while ((U *)pDVar10 != pUVar1);
  goto LAB_00201ffa;
}

Assistant:

void CLUFactor<R>::packRows()
{
   int n, i, j, l_row;
   Dring* ring, *list;

   int* l_ridx = u.row.idx;
   R* l_rval = u.row.val.data();
   int* l_rlen = u.row.len;
   int* l_rmax = u.row.max;
   int* l_rbeg = u.row.start;

   n = 0;
   list = &(u.row.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_row = ring->idx;

      if(l_rbeg[l_row] != n)
      {
         do
         {
            l_row = ring->idx;
            i = l_rbeg[l_row];
            assert(l_rlen[l_row] <= l_rmax[l_row]);
            l_rbeg[l_row] = n;
            l_rmax[l_row] = l_rlen[l_row];
            j = i + l_rlen[l_row];

            for(; i < j; ++i, ++n)
            {
               assert(n <= i);
               l_ridx[n] = l_ridx[i];
               l_rval[n] = l_rval[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackRows;
      }

      n += l_rlen[l_row];

      l_rmax[l_row] = l_rlen[l_row];
   }

terminatePackRows:

   u.row.max[thedim] = 0;
   u.row.used = n;
}